

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O2

size_t qHash(QUrlQuery *key,size_t seed)

{
  QUrlQueryPrivate *pQVar1;
  result_type rVar2;
  long in_FS_OFFSET;
  QHashCombine hash;
  QHashCombine local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (key->d).d.ptr;
  if (pQVar1 != (QUrlQueryPrivate *)0x0) {
    local_19 = (QHashCombine)0xaa;
    rVar2 = QtPrivate::QHashCombine::operator()(&local_19,seed,&pQVar1->valueDelimiter);
    rVar2 = QtPrivate::QHashCombine::operator()(&local_19,rVar2,&pQVar1->pairDelimiter);
    seed = QtPrivate::QHashCombine::operator()(&local_19,rVar2,&pQVar1->itemList);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return seed;
  }
  __stack_chk_fail();
}

Assistant:

size_t qHash(const QUrlQuery &key, size_t seed) noexcept
{
    if (const QUrlQueryPrivate *d = key.d) {
        QtPrivate::QHashCombine hash;
        // keep in sync with operator==:
        seed = hash(seed, d->valueDelimiter);
        seed = hash(seed, d->pairDelimiter);
        seed = hash(seed, d->itemList);
    }
    return seed;
}